

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O1

void mi_collect_reduce(size_t target_size)

{
  mi_tld_t *pmVar1;
  mi_heap_t *heap;
  size_t target;
  
  mi_collect(true);
  heap = mi_heap_get_default();
  pmVar1 = heap->tld;
  if (target_size < 0x2000000) {
    target = mi_option_get_clamp(mi_option_target_segments_per_thread,1,0x400);
  }
  else {
    target = target_size >> 0x19;
  }
  mi_segments_try_abandon_to_target(heap,target,&pmVar1->segments);
  return;
}

Assistant:

void mi_collect_reduce(size_t target_size) mi_attr_noexcept {
  mi_collect(true);
  mi_heap_t* heap = mi_heap_get_default();
  mi_segments_tld_t* tld = &heap->tld->segments;
  size_t target = target_size / MI_SEGMENT_SIZE;
  if (target == 0) {
    target = (size_t)mi_option_get_clamp(mi_option_target_segments_per_thread, 1, 1024);
  }
  mi_segments_try_abandon_to_target(heap, target, tld);
}